

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pca.cpp
# Opt level: O2

void __thiscall PCA::fit(PCA *this,Matrix *X)

{
  int i;
  long i_00;
  double __x;
  int n;
  Vector mu;
  Matrix res;
  Vector iesima;
  int local_1a4;
  Matrix<double,__1,_1,_0,__1,_1> local_1a0;
  PCA *local_190;
  double local_188;
  Matrix<double,__1,__1,_1,__1,__1> local_180;
  Matrix<double,__1,_1,_0,__1,_1> local_168;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>,_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0>
  local_158;
  CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>
  local_e8;
  Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> local_a0;
  MatrixBase<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>> local_68 [56];
  
  local_1a4 = (int)(X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.
                   m_rows;
  local_158.m_rhs = local_158.m_lhs.m_matrix;
  local_190 = this;
  local_158.m_lhs.m_matrix = X;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::internal::member_sum<double,double>,1>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1a0,
             (DenseBase<Eigen::PartialReduxExpr<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_Eigen::internal::member_sum<double,_double>,_1>_>
              *)&local_158);
  Eigen::MatrixBase<Eigen::Matrix<double,-1,1,0,-1,1>>::operator/
            ((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_158,(MatrixBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_1a0,&local_1a4);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,1,0,_1,1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,1,0,_1,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>const>const>>
            (&local_1a0,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&local_158);
  local_158.m_lhs.m_matrix =
       (non_const_type)
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<long>(&local_168,(long *)&local_158);
  local_158.m_lhs.m_matrix =
       (non_const_type)
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_rows;
  local_e8.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>.m_data =
       (PointerType)
       (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>).m_storage.m_cols;
  Eigen::Matrix<double,-1,-1,1,-1,-1>::Matrix<long,long>
            ((Matrix<double,_1,_1,1,_1,_1> *)&local_180,(long *)&local_158,(long *)&local_e8);
  for (i_00 = 0; i_00 < local_1a4; i_00 = i_00 + 1) {
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              ((Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true> *)local_68,X,i_00);
    Eigen::MatrixBase<Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>>::operator-
              (&local_e8,local_68,(MatrixBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_1a0)
    ;
    __x = (double)(local_1a4 + -1);
    if (__x < 0.0) {
      local_188 = sqrt(__x);
    }
    else {
      local_188 = SQRT(__x);
    }
    Eigen::
    MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,-1,-1,1,-1,-1>,1,-1,true>const,Eigen::Matrix<double,-1,1,0,-1,1>const>>
    ::operator/((CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                 *)&local_158,
                (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>>
                 *)&local_e8,&local_188);
    Eigen::Block<Eigen::Matrix<double,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>::Block
              (&local_a0,&local_180,i_00);
    Eigen::internal::
    call_assignment<Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,double>,Eigen::Block<Eigen::Matrix<double,_1,_1,1,_1,_1>,1,_1,true>const,Eigen::Matrix<double,_1,1,0,_1,1>const>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,_1,1,1,_1>const>const>>
              (&local_a0,
               (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_const_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_1,__1,_1,_1,__1>_>_>
                *)&local_158);
  }
  local_e8.m_lhs.
  super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>.
  super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>.
  super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>.m_data =
       (PointerType)&local_180;
  local_158 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,-1,-1,1,-1,-1>>>::operator*
                        ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>> *)
                         &local_e8,
                         (MatrixBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_> *)
                         local_e8.m_lhs.
                         super_BlockImpl<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_Eigen::Dense>
                         .
                         super_BlockImpl_dense<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true,_true>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_1>
                         .
                         super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,__1,_1,__1,__1>,_1,__1,_true>,_0>
                         .m_data);
  Eigen::internal::
  call_assignment<Eigen::Matrix<double,_1,_1,1,_1,_1>,Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_1,_1,1,_1,_1>>,Eigen::Matrix<double,_1,_1,1,_1,_1>,0>>
            (&local_190->covarianza,&local_158);
  free(local_180.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_1,__1,__1>_>.m_storage.m_data);
  free(local_168.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(local_1a0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  return;
}

Assistant:

void PCA::fit(Matrix X)
{
	int n = X.rows();

	Vector mu = X.rowwise().sum();
	mu = mu / n;

	Vector iesima(X.cols());

	Matrix res(X.rows(), X.cols());

	for(int i = 0; i < n; i++)
		res.row(i) = (X.row(i) - mu) / sqrt(n - 1);

	covarianza = (res.transpose())*res;
}